

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  char *description;
  Descriptor *pDVar4;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
    pDVar4 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,MVar5.descriptor,field,"HasField");
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ == pDVar4) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if ((field->field_0x1 & 8) != 0) {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        bVar1 = internal::ExtensionSet::Has
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                           field->number_);
        return bVar1;
      }
      pOVar3 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar3 != (OneofDescriptor *)0x0) {
        bVar1 = HasOneofField(this,message,field);
        return bVar1;
      }
      bVar1 = HasFieldSingular(this,message,field);
      return bVar1;
    }
    pDVar4 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar4,field,"HasField",description);
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(HasField, &message);
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (schema_.InRealOneof(field)) {
      return HasOneofField(message, field);
    } else {
      return HasFieldSingular(message, field);
    }
  }
}